

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O1

void __thiscall ThreadParser::domCheckSum(ThreadParser *this,DOMNode *node)

{
  undefined4 uVar1;
  ushort *puVar2;
  DOMNode *pDVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  ushort uVar7;
  long lVar8;
  
  uVar1 = (**(code **)(*(long *)node + 0x20))(node);
  switch(uVar1) {
  case 1:
    puVar2 = (ushort *)(**(code **)(*(long *)node + 0x10))(node);
    plVar4 = (long *)(**(code **)(*(long *)node + 0x58))(node);
    lVar5 = (**(code **)(*plVar4 + 0x28))(plVar4);
    if (lVar5 != 0) {
      lVar8 = 0;
      do {
        pDVar3 = (DOMNode *)(**(code **)(*plVar4 + 0x18))(plVar4,lVar8);
        domCheckSum(this,pDVar3);
        lVar8 = lVar8 + 1;
      } while (lVar5 != lVar8);
    }
    uVar7 = *puVar2;
    if (uVar7 != 0) {
      iVar6 = this->fCheckSum;
      do {
        puVar2 = puVar2 + 1;
        iVar6 = iVar6 * 5 + (uint)uVar7;
        uVar7 = *puVar2;
      } while (uVar7 != 0);
      this->fCheckSum = iVar6;
    }
    for (pDVar3 = (DOMNode *)(**(code **)(*(long *)node + 0x38))(node); pDVar3 != (DOMNode *)0x0;
        pDVar3 = (DOMNode *)(**(code **)(*(long *)pDVar3 + 0x50))(pDVar3)) {
      domCheckSum(this,pDVar3);
    }
    break;
  case 2:
    puVar2 = (ushort *)(**(code **)(*(long *)node + 0x10))(node);
    uVar7 = *puVar2;
    if (uVar7 != 0) {
      iVar6 = this->fCheckSum;
      do {
        puVar2 = puVar2 + 1;
        iVar6 = iVar6 * 5 + (uint)uVar7;
        uVar7 = *puVar2;
      } while (uVar7 != 0);
      this->fCheckSum = iVar6;
    }
    puVar2 = (ushort *)(**(code **)(*(long *)node + 0x18))(node);
    if (puVar2 == (ushort *)0x0) {
      return;
    }
    uVar7 = *puVar2;
    if (uVar7 == 0) {
      return;
    }
    iVar6 = this->fCheckSum;
    do {
      puVar2 = puVar2 + 1;
      iVar6 = iVar6 * 5 + (uint)uVar7;
      uVar7 = *puVar2;
    } while (uVar7 != 0);
    goto LAB_001060d0;
  case 3:
  case 4:
    puVar2 = (ushort *)(**(code **)(*(long *)node + 0x18))(node);
    uVar7 = *puVar2;
    if (uVar7 == 0) {
      return;
    }
    iVar6 = this->fCheckSum;
    do {
      puVar2 = puVar2 + 1;
      iVar6 = iVar6 * 5 + (uint)uVar7;
      uVar7 = *puVar2;
    } while (uVar7 != 0);
LAB_001060d0:
    this->fCheckSum = iVar6;
    break;
  case 5:
  case 9:
    for (pDVar3 = (DOMNode *)(**(code **)(*(long *)node + 0x38))(node); pDVar3 != (DOMNode *)0x0;
        pDVar3 = (DOMNode *)(**(code **)(*(long *)pDVar3 + 0x50))(pDVar3)) {
      domCheckSum(this,pDVar3);
    }
  }
  return;
}

Assistant:

void ThreadParser::domCheckSum(const DOMNode *node)
{
    const XMLCh        *s;
    DOMNode          *child;
    DOMNamedNodeMap  *attributes;

    switch (node->getNodeType() )
    {
    case DOMNode::ELEMENT_NODE:
        {
            s = node->getNodeName();   // the element name

            attributes = node->getAttributes();  // Element's attributes
            XMLSize_t numAttributes = attributes->getLength();
            XMLSize_t i;
            for (i=0; i<numAttributes; i++)
                domCheckSum(attributes->item(i));

            addToCheckSum(s);          // Content and Children
            for (child=node->getFirstChild(); child!=0; child=child->getNextSibling())
                domCheckSum(child);

            break;
        }

    case DOMNode::ATTRIBUTE_NODE:
        {
            s = node->getNodeName();  // The attribute name
            addToCheckSum(s);
            s = node->getNodeValue();  // The attribute value
            if (s != 0)
                addToCheckSum(s);
            break;
        }

    case DOMNode::TEXT_NODE:
    case DOMNode::CDATA_SECTION_NODE:
        {
            s = node->getNodeValue();
            addToCheckSum(s);
            break;
        }

    case DOMNode::ENTITY_REFERENCE_NODE:
    case DOMNode::DOCUMENT_NODE:
        {
            // For entity references and the document, nothing is dirctly
            //  added to the checksum, but we do want to process the chidren nodes.
            //
            for (child=node->getFirstChild(); child!=0; child=child->getNextSibling())
                domCheckSum(child);
            break;
        }
    case DOMNode::ENTITY_NODE:
    case DOMNode::PROCESSING_INSTRUCTION_NODE:
    case DOMNode::COMMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::NOTATION_NODE:
        break;
    }
}